

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

uint8_t __thiscall wabt::ElemSegment::GetFlags(ElemSegment *this,Module *module)

{
  SegmentKind SVar1;
  Enum EVar2;
  pointer pEVar3;
  Index IVar4;
  long lVar5;
  byte bVar6;
  long lVar7;
  pointer pEVar8;
  
  SVar1 = this->kind;
  EVar2 = (this->elem_type).enum_;
  if (SVar1 == Declared) {
    bVar6 = 3;
  }
  else if (SVar1 == Passive) {
    bVar6 = 1;
  }
  else if (SVar1 == Active) {
    IVar4 = BindingHash::FindIndex(&module->table_bindings,&this->table_var);
    bVar6 = (IVar4 != 0) * '\x02';
  }
  else {
    bVar6 = 0;
  }
  if (EVar2 != FuncRef) goto LAB_00167d0a;
  pEVar8 = (this->elem_exprs).super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (this->elem_exprs).super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pEVar3 - (long)pEVar8;
  for (lVar5 = lVar7 / 0x58 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    if (pEVar8->kind != RefFunc) goto LAB_00167d05;
    if (pEVar8[1].kind != RefFunc) {
      pEVar8 = pEVar8 + 1;
      goto LAB_00167d05;
    }
    if (pEVar8[2].kind != RefFunc) {
      pEVar8 = pEVar8 + 2;
      goto LAB_00167d05;
    }
    if (pEVar8[3].kind != RefFunc) {
      pEVar8 = pEVar8 + 3;
      goto LAB_00167d05;
    }
    pEVar8 = pEVar8 + 4;
    lVar7 = lVar7 + -0x160;
  }
  lVar7 = lVar7 / 0x58;
  if (lVar7 == 1) {
LAB_00167ce6:
    if (pEVar8->kind == RefFunc) {
      pEVar8 = pEVar3;
    }
  }
  else if (lVar7 == 2) {
LAB_00167cdd:
    if (pEVar8->kind == RefFunc) {
      pEVar8 = pEVar8 + 1;
      goto LAB_00167ce6;
    }
  }
  else {
    if (lVar7 != 3) {
      return bVar6;
    }
    if (pEVar8->kind == RefFunc) {
      pEVar8 = pEVar8 + 1;
      goto LAB_00167cdd;
    }
  }
LAB_00167d05:
  if (pEVar8 == pEVar3) {
    return bVar6;
  }
LAB_00167d0a:
  return bVar6 | 4;
}

Assistant:

uint8_t ElemSegment::GetFlags(const Module* module) const {
  uint8_t flags = 0;

  bool all_ref_func = elem_type == Type::FuncRef;

  switch (kind) {
    case SegmentKind::Active: {
      Index table_index = module->GetTableIndex(table_var);
      if (table_index != 0) {
        flags |= SegExplicitIndex;
      }
      break;
    }

    case SegmentKind::Passive:
      flags |= SegPassive;
      break;

    case SegmentKind::Declared:
      flags |= SegDeclared;
      break;
  }

  all_ref_func = all_ref_func &&
                 std::all_of(elem_exprs.begin(), elem_exprs.end(),
                             [](const ElemExpr& elem_expr) {
                               return elem_expr.kind == ElemExprKind::RefFunc;
                             });
  if (!all_ref_func) {
    flags |= SegUseElemExprs;
  }

  return flags;
}